

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# header.hpp
# Opt level: O1

void __thiscall CompoundFile::Header::load(Header *this,istream *stream)

{
  Exception *this_00;
  int16_t sectorSizePower;
  uint uVar1;
  long lVar2;
  char byteOrder [3];
  char fileID [9];
  wstring local_58;
  long local_38;
  char local_30;
  
  local_30 = '\0';
  local_38 = 0;
  std::istream::read((char *)stream,(long)&local_38);
  if (local_30 == '\0' && local_38 == -0x1ee54e5e1fee3030) {
    std::istream::seekg((long)stream,0x14);
    local_58._M_dataplus._M_p = local_58._M_dataplus._M_p & 0xffffffffff000000;
    std::istream::read((char *)stream,(long)&local_58);
    this->m_byteOrder =
         (uint)(local_58._M_dataplus._M_p._2_1_ == '\0' && (short)local_58._M_dataplus._M_p == -2);
    lVar2 = 0;
    uVar1 = 0;
    do {
      local_58._M_dataplus._M_p = local_58._M_dataplus._M_p & 0xffffffffffffff00;
      std::istream::get((char *)stream);
      uVar1 = uVar1 | (uint)(byte)local_58._M_dataplus._M_p << ((byte)lVar2 & 0x1f);
      lVar2 = lVar2 + 8;
    } while (lVar2 != 0x10);
    this->m_sectorSize = 1 << ((byte)uVar1 & 0x1f);
    lVar2 = 0;
    uVar1 = 0;
    do {
      local_58._M_dataplus._M_p = local_58._M_dataplus._M_p & 0xffffffffffffff00;
      std::istream::get((char *)stream);
      uVar1 = uVar1 | (uint)(byte)local_58._M_dataplus._M_p << ((byte)lVar2 & 0x1f);
      lVar2 = lVar2 + 8;
    } while (lVar2 != 0x10);
    this->m_shortSectorSize = 1 << ((byte)uVar1 & 0x1f);
    std::istream::seekg((long)stream,10);
    lVar2 = 0;
    uVar1 = 0;
    do {
      local_58._M_dataplus._M_p = local_58._M_dataplus._M_p & 0xffffffffffffff00;
      std::istream::get((char *)stream);
      uVar1 = uVar1 | (uint)(byte)local_58._M_dataplus._M_p << ((byte)lVar2 & 0x1f);
      lVar2 = lVar2 + 8;
    } while (lVar2 != 0x20);
    this->m_sectorsInSAT = uVar1;
    lVar2 = 0;
    uVar1 = 0;
    do {
      local_58._M_dataplus._M_p = local_58._M_dataplus._M_p & 0xffffffffffffff00;
      std::istream::get((char *)stream);
      uVar1 = uVar1 | (uint)(byte)local_58._M_dataplus._M_p << ((byte)lVar2 & 0x1f);
      lVar2 = lVar2 + 8;
    } while (lVar2 != 0x20);
    (this->m_dirStreamSecID).m_id = uVar1;
    std::istream::seekg((long)stream,4);
    lVar2 = 0;
    uVar1 = 0;
    do {
      local_58._M_dataplus._M_p = local_58._M_dataplus._M_p & 0xffffffffffffff00;
      std::istream::get((char *)stream);
      uVar1 = uVar1 | (uint)(byte)local_58._M_dataplus._M_p << ((byte)lVar2 & 0x1f);
      lVar2 = lVar2 + 8;
    } while (lVar2 != 0x20);
    this->m_streamMinSize = uVar1;
    lVar2 = 0;
    uVar1 = 0;
    do {
      local_58._M_dataplus._M_p = local_58._M_dataplus._M_p & 0xffffffffffffff00;
      std::istream::get((char *)stream);
      uVar1 = uVar1 | (uint)(byte)local_58._M_dataplus._M_p << ((byte)lVar2 & 0x1f);
      lVar2 = lVar2 + 8;
    } while (lVar2 != 0x20);
    (this->m_ssatFirstSecID).m_id = uVar1;
    lVar2 = 0;
    uVar1 = 0;
    do {
      local_58._M_dataplus._M_p = local_58._M_dataplus._M_p & 0xffffffffffffff00;
      std::istream::get((char *)stream);
      uVar1 = uVar1 | (uint)(byte)local_58._M_dataplus._M_p << ((byte)lVar2 & 0x1f);
      lVar2 = lVar2 + 8;
    } while (lVar2 != 0x20);
    this->m_sectorsInSSAT = uVar1;
    lVar2 = 0;
    uVar1 = 0;
    do {
      local_58._M_dataplus._M_p = local_58._M_dataplus._M_p & 0xffffffffffffff00;
      std::istream::get((char *)stream);
      uVar1 = uVar1 | (uint)(byte)local_58._M_dataplus._M_p << ((byte)lVar2 & 0x1f);
      lVar2 = lVar2 + 8;
    } while (lVar2 != 0x20);
    (this->m_msatFirstSecID).m_id = uVar1;
    lVar2 = 0;
    uVar1 = 0;
    do {
      local_58._M_dataplus._M_p = local_58._M_dataplus._M_p & 0xffffffffffffff00;
      std::istream::get((char *)stream);
      uVar1 = uVar1 | (uint)(byte)local_58._M_dataplus._M_p << ((byte)lVar2 & 0x1f);
      lVar2 = lVar2 + 8;
    } while (lVar2 != 0x20);
    this->m_sectorsInMSAT = uVar1;
    return;
  }
  this_00 = (Exception *)__cxa_allocate_exception(0x30);
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>
            ((wstring *)&local_58,L"Wrong file identifier. It isn\'t a compound file.",L"");
  Exception::Exception(this_00,&local_58);
  __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

inline void
Header::load( std::istream & stream )
{
	{
		char fileID[] =
			{ 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00 };

		stream.read( fileID, 8 );

		if( std::strcmp( cIdentifier, fileID ) != 0 )
			throw Exception( L"Wrong file identifier. "
				L"It isn't a compound file." );
	}

	stream.seekg( 20, std::ios::cur );

	{
		char byteOrder[] = { 0x00, 0x00, 0x00 };

		stream.read( byteOrder, 2 );

		if( std::strcmp( byteOrder, cLittleEndian ) == 0 )
			m_byteOrder = Excel::Stream::LittleEndian;
		else
			m_byteOrder = Excel::Stream::BigEndian;
	}

	{
		int16_t sectorSizePower = 0;

		readData( stream, sectorSizePower, 2 );

		m_sectorSize = 1 << sectorSizePower;
	}

	{
		int16_t shortSectorSizePower = 0;

		readData( stream, shortSectorSizePower, 2 );

		m_shortSectorSize = 1 << shortSectorSizePower;
	}

	stream.seekg( 10, std::ios::cur );

	{
		int32_t sectorsInSAT = 0;

		readData( stream, sectorsInSAT, 4 );

		m_sectorsInSAT = sectorsInSAT;
	}

	{
		int32_t dirStreamSecID = 0;

		readData( stream, dirStreamSecID, 4 );

		m_dirStreamSecID = dirStreamSecID;
	}

	stream.seekg( 4, std::ios::cur );

	{
		int32_t streamMinSize = 0;

		readData( stream, streamMinSize, 4 );

		m_streamMinSize = streamMinSize;
	}

	{
		int32_t ssatFirstSecID = 0;

		readData( stream, ssatFirstSecID, 4 );

		m_ssatFirstSecID = ssatFirstSecID;
	}

	{
		int32_t sectorsInSSAT = 0;

		readData( stream, sectorsInSSAT, 4 );

		m_sectorsInSSAT = sectorsInSSAT;
	}

	{
		int32_t msatFirstSecID = 0;

		readData( stream, msatFirstSecID, 4 );

		m_msatFirstSecID = msatFirstSecID;
	}

	{
		int32_t sectorsInMSAT = 0;

		readData( stream, sectorsInMSAT, 4 );

		m_sectorsInMSAT = sectorsInMSAT;
	}
}